

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cost.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::Cost::costFirstPartialDerivativeWRTState
          (Cost *this,double param_1,VectorDynSize *param_2,VectorDynSize *param_3,
          VectorDynSize *param_4)

{
  ostream *poVar1;
  ostringstream errorMsg;
  long *local_1a8;
  long local_198 [2];
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"Method not implemented for cost ",0x20);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_188,(this->m_costName)._M_dataplus._M_p,
                      (this->m_costName)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  iDynTree::reportError("Cost","costFirstPartialDerivativeWRTState",(char *)local_1a8);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return false;
}

Assistant:

bool Cost::costFirstPartialDerivativeWRTState(double /*time*/, const VectorDynSize &/*state*/, const VectorDynSize &/*control*/, VectorDynSize &/*partialDerivative*/)
        {
            std::ostringstream errorMsg;
            errorMsg << "Method not implemented for cost "<< name() << std::endl;
            reportError("Cost", "costFirstPartialDerivativeWRTState", errorMsg.str().c_str());
            return false;
        }